

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FeatureTypes.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::SequenceFeatureType::MergeFrom
          (SequenceFeatureType *this,SequenceFeatureType *from)

{
  void *pvVar1;
  LogMessage *other;
  SizeRange *this_00;
  Int64FeatureType *this_01;
  StringFeatureType *this_02;
  SizeRange *from_00;
  Int64FeatureType *from_01;
  StringFeatureType *from_02;
  LogFinisher local_51;
  LogMessage local_50;
  
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/build_O3/mlmodel/format/FeatureTypes.pb.cc"
               ,0x1044);
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_50,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_51,other);
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  pvVar1 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar1 & 0xfffffffffffffffe));
  }
  from_00 = from->sizerange_;
  if (from_00 != (SizeRange *)0x0 &&
      from != (SequenceFeatureType *)&_SequenceFeatureType_default_instance_) {
    this_00 = this->sizerange_;
    if (this_00 == (SizeRange *)0x0) {
      this_00 = (SizeRange *)operator_new(0x28);
      SizeRange::SizeRange(this_00);
      this->sizerange_ = this_00;
      from_00 = from->sizerange_;
    }
    if (from_00 == (SizeRange *)0x0) {
      from_00 = (SizeRange *)&_SizeRange_default_instance_;
    }
    SizeRange::MergeFrom(this_00,from_00);
  }
  if (from->_oneof_case_[0] != 3) {
    if (from->_oneof_case_[0] != 1) {
      return;
    }
    if (this->_oneof_case_[0] == 1) {
      this_01 = (this->Type_).int64type_;
    }
    else {
      clear_Type(this);
      this->_oneof_case_[0] = 1;
      this_01 = (Int64FeatureType *)operator_new(0x18);
      Int64FeatureType::Int64FeatureType(this_01);
      (this->Type_).int64type_ = this_01;
      if (from->_oneof_case_[0] != 1) {
        protobuf_FeatureTypes_2eproto::InitDefaults();
        from_01 = (Int64FeatureType *)&_Int64FeatureType_default_instance_;
        goto LAB_001e4415;
      }
    }
    from_01 = (from->Type_).int64type_;
LAB_001e4415:
    Int64FeatureType::MergeFrom(this_01,from_01);
    return;
  }
  if (this->_oneof_case_[0] == 3) {
    this_02 = (this->Type_).stringtype_;
  }
  else {
    clear_Type(this);
    this->_oneof_case_[0] = 3;
    this_02 = (StringFeatureType *)operator_new(0x18);
    StringFeatureType::StringFeatureType(this_02);
    (this->Type_).stringtype_ = this_02;
    if (from->_oneof_case_[0] != 3) {
      protobuf_FeatureTypes_2eproto::InitDefaults();
      from_02 = (StringFeatureType *)&_StringFeatureType_default_instance_;
      goto LAB_001e442b;
    }
  }
  from_02 = (from->Type_).stringtype_;
LAB_001e442b:
  StringFeatureType::MergeFrom(this_02,from_02);
  return;
}

Assistant:

void SequenceFeatureType::MergeFrom(const SequenceFeatureType& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:CoreML.Specification.SequenceFeatureType)
  GOOGLE_DCHECK_NE(&from, this);
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  if (from.has_sizerange()) {
    mutable_sizerange()->::CoreML::Specification::SizeRange::MergeFrom(from.sizerange());
  }
  switch (from.Type_case()) {
    case kInt64Type: {
      mutable_int64type()->::CoreML::Specification::Int64FeatureType::MergeFrom(from.int64type());
      break;
    }
    case kStringType: {
      mutable_stringtype()->::CoreML::Specification::StringFeatureType::MergeFrom(from.stringtype());
      break;
    }
    case TYPE_NOT_SET: {
      break;
    }
  }
}